

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidiin.cpp
# Opt level: O2

int anon_unknown.dwarf_1138d::RtMidiIn_getcurrentapi(lua_State *L)

{
  Api AVar1;
  RtMidiIn *this;
  
  this = getRtMidiIn(L,1);
  AVar1 = RtMidiIn::getCurrentApi(this);
  lua_pushinteger(L,AVar1);
  return 1;
}

Assistant:

int RtMidiIn_getcurrentapi(lua_State *L) {
	auto &self = getRtMidiIn(L, 1);
	lua_pushinteger(L, self.getCurrentApi());
	return 1;
}